

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

float __thiscall Json::Value::asFloat(Value *this)

{
  ValueType VVar1;
  double dVar2;
  float local_1d4;
  String local_1c0;
  ostringstream local_190 [8];
  OStringStream oss;
  Value *this_local;
  
  VVar1 = type(this);
  switch(VVar1) {
  case nullValue:
    this_local._4_4_ = 0.0;
    break;
  case intValue:
    this_local._4_4_ = (float)(this->value_).int_;
    break;
  case uintValue:
    dVar2 = integerToDouble((this->value_).uint_);
    this_local._4_4_ = (float)dVar2;
    break;
  case realValue:
    this_local._4_4_ = (float)(this->value_).real_;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,"Value is not convertible to float.");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1c0);
  case booleanValue:
    local_1d4 = 1.0;
    if (((this->value_).bool_ & 1U) == 0) {
      local_1d4 = 0.0;
    }
    this_local._4_4_ = local_1d4;
  }
  return this_local._4_4_;
}

Assistant:

float Value::asFloat() const {
  switch (type()) {
  case intValue:
    return static_cast<float>(value_.int_);
  case uintValue:
#if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return static_cast<float>(value_.uint_);
#else  // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    // This can fail (silently?) if the value is bigger than MAX_FLOAT.
    return static_cast<float>(integerToDouble(value_.uint_));
#endif // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
  case realValue:
    return static_cast<float>(value_.real_);
  case nullValue:
    return 0.0;
  case booleanValue:
    return value_.bool_ ? 1.0F : 0.0F;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to float.");
}